

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

void tcg_region_init_arm(TCGContext_conflict *tcg_ctx)

{
  void *pvVar1;
  size_t size;
  GTree *pGVar2;
  void *pvVar3;
  ulong uVar4;
  void *pvVar5;
  ulong curr_region;
  void *end;
  void *start;
  
  pvVar1 = tcg_ctx->code_gen_buffer;
  size = tcg_ctx->uc->qemu_real_host_page_size;
  uVar4 = (long)pvVar1 + (size - 1);
  pvVar5 = (void *)(uVar4 - uVar4 % size);
  pvVar3 = (void *)(tcg_ctx->code_gen_buffer_size + (long)pvVar1);
  uVar4 = (long)pvVar3 - (long)pvVar5;
  if (pvVar3 < pvVar5 || uVar4 == 0) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
               ,0x1fc,"(char *)aligned < ((char *)tcg_ctx->code_gen_buffer + size)");
  }
  uVar4 = uVar4 - uVar4 % size;
  if (size * 2 <= uVar4) {
    (tcg_ctx->region).n = 1;
    (tcg_ctx->region).size = uVar4 - size;
    (tcg_ctx->region).stride = uVar4;
    (tcg_ctx->region).start = pvVar1;
    (tcg_ctx->region).start_aligned = pvVar5;
    (tcg_ctx->region).end = (void *)((long)pvVar3 + (-size - (ulong)pvVar3 % size));
    uVar4 = 1;
    for (curr_region = 0; curr_region < uVar4; curr_region = curr_region + 1) {
      tcg_region_bounds(tcg_ctx,curr_region,&start,&end);
      qemu_mprotect_none(end,size);
      uVar4 = (tcg_ctx->region).n;
    }
    pGVar2 = g_tree_new(tb_tc_cmp);
    tcg_ctx->tree = pGVar2;
    return;
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
             ,0x206,"region_size >= 2 * page_size");
}

Assistant:

void tcg_region_init(TCGContext *tcg_ctx)
{
    void *buf = tcg_ctx->code_gen_buffer;
    void *aligned;
    size_t size = tcg_ctx->code_gen_buffer_size;
    size_t page_size = tcg_ctx->uc->qemu_real_host_page_size;
    size_t region_size;
    size_t n_regions;
    size_t i;

    n_regions = 1;

    /* The first region will be 'aligned - buf' bytes larger than the others */
    aligned = (void *)QEMU_ALIGN_PTR_UP(buf, page_size);
    g_assert((char *)aligned < ((char *)tcg_ctx->code_gen_buffer + size));
    /*
     * Make region_size a multiple of page_size, using aligned as the start.
     * As a result of this we might end up with a few extra pages at the end of
     * the buffer; we will assign those to the last region.
     */
    region_size = (size - ((char *)aligned - (char *)buf)) / n_regions;
    region_size = QEMU_ALIGN_DOWN(region_size, page_size);

    /* A region must have at least 2 pages; one code, one guard */
    g_assert(region_size >= 2 * page_size);

    /* init the region struct */
    tcg_ctx->region.n = n_regions;
    tcg_ctx->region.size = region_size - page_size;
    tcg_ctx->region.stride = region_size;
    tcg_ctx->region.start = buf;
    tcg_ctx->region.start_aligned = aligned;
    /* page-align the end, since its last page will be a guard page */
    tcg_ctx->region.end = (void *)QEMU_ALIGN_PTR_DOWN((char *)buf + size, page_size);
    /* account for that last guard page */
    tcg_ctx->region.end = (void *)((char *)tcg_ctx->region.end - page_size);

    /* set guard pages */
    for (i = 0; i < tcg_ctx->region.n; i++) {
        void *start, *end;

        tcg_region_bounds(tcg_ctx, i, &start, &end);

        (void)qemu_mprotect_none(end, page_size);
    }

    tcg_ctx->tree = g_tree_new(tb_tc_cmp);

}